

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O1

IRType crec_ct2irt(CTState *cts,CType *ct)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  IRType IVar4;
  bool bVar5;
  bool bVar6;
  
  if ((ct->info & 0xf0000000) == 0x50000000) {
    ct = (CType *)((long)&cts->tab->info + (ulong)((ct->info & 0xffff) * 0x18));
  }
  uVar1 = ct->info;
  if (uVar1 < 0x10000000) {
    uVar2 = ct->size;
    if ((uVar1 >> 0x1a & 1) != 0) {
      bVar5 = uVar2 == 4;
      bVar6 = uVar2 == 8;
LAB_0015c6ba:
      IVar4 = IRT_NUM;
      if (!bVar6) {
        IVar4 = (uint)bVar5 * 3 + IRT_CDATA;
      }
      return IVar4;
    }
    uVar3 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    if (3 < uVar3) {
      return IRT_CDATA;
    }
    IVar4 = (uVar1 >> 0x17 & 1) + uVar3 * 2 + IRT_I8;
  }
  else {
    if ((uVar1 & 0xf0000000) != 0x20000000) {
      if ((uVar1 & 0xf4000000) != 0x34000000) {
        return IRT_CDATA;
      }
      bVar5 = ct->size == 8;
      bVar6 = ct->size == 0x10;
      goto LAB_0015c6ba;
    }
    IVar4 = (uint)(ct->size == 8) * 4 + IRT_P32;
  }
  return IVar4;
}

Assistant:

static IRType crec_ct2irt(CTState *cts, CType *ct)
{
  if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
  if (LJ_LIKELY(ctype_isnum(ct->info))) {
    if ((ct->info & CTF_FP)) {
      if (ct->size == sizeof(double))
	return IRT_NUM;
      else if (ct->size == sizeof(float))
	return IRT_FLOAT;
    } else {
      uint32_t b = lj_fls(ct->size);
      if (b <= 3)
	return IRT_I8 + 2*b + ((ct->info & CTF_UNSIGNED) ? 1 : 0);
    }
  } else if (ctype_isptr(ct->info)) {
    return (LJ_64 && ct->size == 8) ? IRT_P64 : IRT_P32;
  } else if (ctype_iscomplex(ct->info)) {
    if (ct->size == 2*sizeof(double))
      return IRT_NUM;
    else if (ct->size == 2*sizeof(float))
      return IRT_FLOAT;
  }
  return IRT_CDATA;
}